

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void __thiscall VM::exec(VM *this)

{
  uchar **__args;
  pointer *pppuVar1;
  uchar uVar2;
  int iVar3;
  int iVar4;
  uchar *puVar5;
  FunctionInformation *pFVar6;
  iterator __position;
  pointer ppuVar7;
  StackFrame *pSVar8;
  bool bVar9;
  ulong uVar10;
  pointer ppSVar11;
  bool bVar12;
  size_t sVar13;
  uchar **out;
  size_t sVar14;
  bool bVar15;
  int offset;
  size_t sz;
  uchar *local_58;
  StackFrame **local_50;
  uchar **local_48;
  vector<unsigned_char*,std::allocator<unsigned_char*>> *local_40;
  size_t local_38;
  
  __args = &this->cip;
  local_48 = &this->rsp;
  local_40 = (vector<unsigned_char*,std::allocator<unsigned_char*>> *)&this->retstack;
  out = local_48;
LAB_00104513:
  puVar5 = *__args;
  uVar2 = *puVar5;
  *__args = puVar5 + 1;
  switch(uVar2) {
  case '\0':
    iVar3 = *(int *)(puVar5 + 1);
    this->cip = puVar5 + 5;
    push(this,puVar5 + 5,(long)iVar3);
    this->cip = this->cip + iVar3;
    goto LAB_00104513;
  case '\x01':
    break;
  case '\x02':
    pop<unsigned_long>(this,&local_38);
    pop<void*>(this,&local_58);
    push(this,local_58,local_38);
    goto LAB_00104513;
  case '\x03':
    ppSVar11 = (this->stack).super__Vector_base<StackFrame_*,_std::allocator<StackFrame_*>_>._M_impl
               .super__Vector_impl_data._M_finish;
    pSVar8 = ppSVar11[-2];
    memcpy(*(void **)ppSVar11[-1]->ptr,pSVar8->ptr,pSVar8->size);
    pop(this);
    break;
  case '\x04':
    pop<int>(this,(int *)&local_58);
    pSVar8 = (this->stack).super__Vector_base<StackFrame_*,_std::allocator<StackFrame_*>_>._M_impl.
             super__Vector_impl_data._M_finish[-1];
    sVar13 = pSVar8->size;
    if (sVar13 != 0) {
      sVar14 = 0;
      bVar9 = false;
      do {
        bVar12 = bVar9;
        bVar15 = pSVar8->ptr[sVar14] != '\0';
        sVar14 = sVar14 + 1;
        bVar9 = (bool)(bVar12 | bVar15);
      } while (sVar13 != sVar14);
      pop(this);
      if (bVar12 || bVar15) {
        this->cip = this->firmware + (int)local_58;
      }
      goto LAB_00104513;
    }
    break;
  case '\x05':
    iVar3 = *(int *)(puVar5 + 1);
    this->cip = puVar5 + 5;
    pFVar6 = this->imports;
    if (pFVar6[iVar3].isExternal == true) {
      iVar4 = pFVar6[iVar3].argcount;
      sVar13 = (size_t)iVar4;
      local_50 = (StackFrame **)operator_new__(-(ulong)(sVar13 + 1 >> 0x3d != 0) | sVar13 * 8 + 8);
      if (iVar4 == 0) {
        platform_call_wrapper
                  (pFVar6[iVar3].ptr,local_50,sVar13,(long)pFVar6[iVar3].outsize,
                   pFVar6[iVar3].isVarArgs,this);
      }
      else {
        ppSVar11 = (this->stack).super__Vector_base<StackFrame_*,_std::allocator<StackFrame_*>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
        uVar10 = 0;
        do {
          local_50[sVar13 + ~uVar10] = ppSVar11[-1];
          do {
            ppSVar11 = ppSVar11 + -1;
            pSVar8 = (*ppSVar11)->vref;
            (this->stack).super__Vector_base<StackFrame_*,_std::allocator<StackFrame_*>_>._M_impl.
            super__Vector_impl_data._M_finish = ppSVar11;
          } while (pSVar8 != (StackFrame *)0x0);
          uVar10 = uVar10 + 1;
        } while (uVar10 != sVar13);
        platform_call_wrapper
                  (pFVar6[iVar3].ptr,local_50,sVar13,(long)pFVar6[iVar3].outsize,
                   pFVar6[iVar3].isVarArgs,this);
        if (iVar4 != 0) {
          sVar14 = 0;
          do {
            pSVar8 = local_50[sVar14];
            if ((pSVar8 != (StackFrame *)0x0) && (pSVar8->ptr != (uchar *)0x0)) {
              operator_delete__(pSVar8->ptr);
            }
            operator_delete(pSVar8);
            sVar14 = sVar14 + 1;
          } while (sVar13 != sVar14);
        }
      }
      operator_delete__(local_50);
      out = local_48;
    }
    else {
      __position._M_current =
           (this->retstack).super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->retstack).super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_char*,std::allocator<unsigned_char*>>::
        _M_realloc_insert<unsigned_char*const&>(local_40,__position,__args);
      }
      else {
        *__position._M_current = puVar5 + 5;
        pppuVar1 = &(this->retstack).
                    super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>._M_impl.
                    super__Vector_impl_data._M_finish;
        *pppuVar1 = *pppuVar1 + 1;
      }
      this->cip = this->programBase + pFVar6[iVar3].offset;
    }
    goto LAB_00104513;
  case '\x06':
    ppuVar7 = (this->retstack).super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    if (ppuVar7 ==
        (this->retstack).super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>.
        _M_impl.super__Vector_impl_data._M_start) {
      return;
    }
    this->cip = ppuVar7[-1];
    (this->retstack).super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppuVar7 + -1;
    goto LAB_00104513;
  case '\a':
    pop<unsigned_char*>(this,out);
    goto LAB_00104513;
  case '\b':
    push(this,out,8);
    goto LAB_00104513;
  case '\t':
    goto switchD_00104531_caseD_9;
  default:
    puts("Illegal instruction");
    abort();
  }
  pop(this);
  goto LAB_00104513;
switchD_00104531_caseD_9:
  local_58 = (this->stack).super__Vector_base<StackFrame_*,_std::allocator<StackFrame_*>_>._M_impl.
             super__Vector_impl_data._M_finish[-1]->ptr;
  push(this,&local_58,8);
  ppSVar11 = (this->stack).super__Vector_base<StackFrame_*,_std::allocator<StackFrame_*>_>._M_impl.
             super__Vector_impl_data._M_finish;
  ppSVar11[-1]->vref = ppSVar11[-2];
  goto LAB_00104513;
}

Assistant:

void exec() {
    while(1) {
    unsigned char opcode;
    unsigned char* oldip = cip;
    read(opcode);
    switch(opcode) {
    case 0:
    {
      //PUSH constant
      int len;
      read(len);
      push(cip,len);
      cip+=len;
    }
      break;
    case 1:
    {
      //POP
      pop();
    }
      break;
    case 2:
    {
      //Load
      void* addr;
      size_t sz;
      pop(sz);
      pop(addr);
      push(addr,sz);
    }
      break;
    case 3:
    {
      //Store
      StackFrame* val = stack[stack.size()-2];
      StackFrame* addr_val = stack[stack.size()-1];
      void* addr;
      memcpy(&addr,addr_val->ptr,sizeof(void*));
      memcpy(addr,val->ptr,val->size);
      pop();
      pop();
    }
      break;
    case 4:
    {
      //Absolute branch
      int offset;
      pop(offset);
      bool shouldBranch = false;
      
      StackFrame* frame = stack.back();
      for(size_t i = 0;i<frame->size;i++) {
	if(frame->ptr[i]) {
	  shouldBranch = true;
	}
      }
      
      pop();
      if(shouldBranch) {
	cip =firmware+offset;
      }
    }
      break;
    case 5:
    {
      //Procedure call
      int funcid;
      read(funcid);
      FunctionInformation* info = imports+funcid;
      size_t argcount = info->argcount;
      if(info->isExternal) {
      StackFrame** args = new StackFrame*[argcount+1];
      for(size_t i = 0;i<argcount;i++) {
	args[argcount-i-1] = stack.back();
	rmstack();
      }
      
      platform_call_wrapper(info->ptr,args,argcount,info->outsize,info->isVarArgs,this);
      for(size_t i = 0;i<argcount;i++) {
	delete args[i];
      }
      delete[] args;
      }else {
	retstack.push_back(cip);
	cip = programBase+info->offset;
      }
    }
      break;
    case 6:
    {
      //Procedure call return/exit
      if(!retstack.size()) {
	return;
      }
      cip = retstack.back();
      retstack.pop_back();
    }
      break;
    case 7:
    {
      //Set stack pointer
      pop(rsp);
    }
      break;
    case 8:
    {
      //Read stack pointer
      push(&rsp,sizeof(rsp));
    }
      break;
    case 9:
    {
      //This pointer (reference)
      void* addr = stack.back()->ptr;
      push(&addr,sizeof(addr));
      stack.back()->vref = stack[stack.size()-2];
    }
      break;
    default:
    {
      printf("Illegal instruction\n");
      abort();
    }
      break;
  }
    }
  }